

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool.c
# Opt level: O2

gotcha_error_t
get_configuration_value(char *tool_name,gotcha_config_key_t key,void *location_to_store_result)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  tool_t *ptVar4;
  gotcha_error_t gVar5;
  char *__format;
  FILE *__stream;
  undefined8 uVar6;
  
  ptVar4 = get_tool(tool_name);
  __stream = _stderr;
  if (ptVar4 == (tool_t *)0x0) {
    gVar5 = GOTCHA_INVALID_TOOL;
    if (debug_level != 0) {
      uVar2 = gotcha_gettid();
      uVar3 = getpid();
      __format = "ERROR [%d/%d][%s:%u] - Property being examined for nonexistent tool %s\n";
      uVar6 = 0xab;
LAB_0010484f:
      fprintf(__stream,__format,(ulong)uVar2,(ulong)uVar3,"tool.c",uVar6,tool_name);
    }
  }
  else {
    if (key == GOTCHA_PRIORITY) {
      *(undefined4 *)location_to_store_result = 0xffffffff;
    }
    __stream = _stderr;
    gVar5 = GOTCHA_SUCCESS;
    for (; ptVar4 != (tool_t *)0x0; ptVar4 = ptVar4->parent_tool) {
      if (key != GOTCHA_PRIORITY) {
        gVar5 = GOTCHA_INTERNAL;
        if (debug_level == 0) {
          return GOTCHA_INTERNAL;
        }
        uVar2 = gotcha_gettid();
        uVar3 = getpid();
        __format = "ERROR [%d/%d][%s:%u] - Invalid property being configured on tool %s\n";
        uVar6 = 0xbb;
        goto LAB_0010484f;
      }
      iVar1 = (ptVar4->config).priority;
      if (iVar1 != -1) {
        *(int *)location_to_store_result = iVar1;
        return GOTCHA_SUCCESS;
      }
    }
  }
  return gVar5;
}

Assistant:

enum gotcha_error_t get_configuration_value(const char* tool_name, enum gotcha_config_key_t key, void* location_to_store_result){
  struct tool_t* tool = get_tool(tool_name);
  if(tool==NULL){
     error_printf("Property being examined for nonexistent tool %s\n", tool_name);
     return GOTCHA_INVALID_TOOL;
  }
  get_default_configuration_value(key, location_to_store_result);
  int found_valid_value = 0;
  while( (tool!=NULL) && !(found_valid_value) ){
    struct gotcha_configuration_t config = tool->config;
    if(key==GOTCHA_PRIORITY){
      int current_priority = config.priority;
      if(current_priority!=UNSET_PRIORITY){
        *((int*)(location_to_store_result)) = config.priority; 
        found_valid_value = 1;
        return GOTCHA_SUCCESS;
      }
    }
    else{
      error_printf("Invalid property being configured on tool %s\n", tool_name);
      return GOTCHA_INTERNAL;
    }
    tool = tool->parent_tool;
  }
  return GOTCHA_SUCCESS;  
}